

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tjbench.c
# Opt level: O0

int decompTest(char *fileName)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int *piVar8;
  char *pcVar9;
  size_t sVar10;
  unsigned_long uVar11;
  uchar *puVar12;
  char *pcVar13;
  char *in_RDI;
  char *pcVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  char *_tjErrorStr_2;
  int _tjErrorCode_2;
  char *_tjErrorStr_1;
  int _tjErrorCode_1;
  char *_tjErrorStr;
  int _tjErrorCode;
  int tsubsamp;
  int tntilesh;
  int tntilesw;
  int ttileh;
  int ttilew;
  int th;
  int tw;
  int cs;
  int subsamp;
  int ntilesh;
  int ntilesw;
  int tileh;
  int tilew;
  int h;
  int w;
  char tempStr2 [80];
  char tempStr [80];
  char *temp;
  int decompsrc;
  int retval;
  int iter;
  int i;
  int col;
  int row;
  int tile;
  int ps;
  double elapsed;
  double start;
  tjtransform *t;
  unsigned_long totalJpegSize;
  unsigned_long srcSize;
  unsigned_long *jpegSize;
  uchar *srcBuf;
  uchar **jpegBuf;
  tjhandle handle;
  FILE *file;
  int in_stack_00000368;
  int in_stack_0000036c;
  uchar *in_stack_00000370;
  unsigned_long *in_stack_00000378;
  uchar **in_stack_00000380;
  uchar *in_stack_00000388;
  int in_stack_000003a0;
  int in_stack_000003a8;
  char *in_stack_000003b0;
  int in_stack_000003b8;
  int in_stack_000003c0;
  undefined1 *puVar20;
  char *in_stack_fffffffffffffdd8;
  uint in_stack_fffffffffffffde0;
  uint uVar21;
  int in_stack_fffffffffffffde4;
  undefined4 in_stack_fffffffffffffde8;
  undefined4 in_stack_fffffffffffffdec;
  int *in_stack_fffffffffffffdf0;
  unsigned_long in_stack_fffffffffffffdf8;
  uchar *in_stack_fffffffffffffe00;
  tjhandle in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe20;
  undefined4 in_stack_fffffffffffffe24;
  double in_stack_fffffffffffffe28;
  char *in_stack_fffffffffffffe30;
  int in_stack_fffffffffffffe3c;
  char *in_stack_fffffffffffffe40;
  uint local_1b0;
  uint local_1ac;
  uint local_198;
  uint local_194;
  unsigned_long *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  uint uVar22;
  int iVar23;
  int iVar24;
  int local_140;
  int local_13c;
  uint local_138;
  uint local_134;
  uint uVar25;
  uint uVar26;
  int in_stack_fffffffffffffed8;
  int local_7c;
  int local_78;
  int local_74;
  int local_70;
  int local_6c;
  int local_68;
  int local_64;
  double local_60;
  void *local_50;
  long local_48;
  void *local_38;
  void *local_30;
  undefined8 *local_28;
  tjhandle local_20;
  FILE *local_18;
  undefined4 uVar19;
  
  local_20 = (tjhandle)0x0;
  local_28 = (undefined8 *)0x0;
  local_30 = (void *)0x0;
  local_38 = (void *)0x0;
  local_50 = (void *)0x0;
  local_64 = tjPixelSize[pf];
  local_7c = 0;
  uVar26 = 0;
  uVar25 = 0;
  local_13c = 1;
  local_140 = 1;
  iVar24 = -1;
  iVar23 = -1;
  local_18 = fopen(in_RDI,"rb");
  if (local_18 == (FILE *)0x0) {
    piVar8 = __errno_location();
    pcVar9 = strerror(*piVar8);
    printf("ERROR in line %d while %s:\n%s\n",0x218,"opening file",pcVar9);
    local_7c = -1;
  }
  else {
    iVar1 = fseek(local_18,0,2);
    if ((iVar1 < 0) || (sVar10 = ftell(local_18), sVar10 == 0xffffffffffffffff)) {
      piVar8 = __errno_location();
      pcVar9 = strerror(*piVar8);
      printf("ERROR in line %d while %s:\n%s\n",0x21b,"determining file size",pcVar9);
      local_7c = -1;
    }
    else {
      local_30 = malloc(sVar10);
      if (local_30 == (void *)0x0) {
        piVar8 = __errno_location();
        pcVar9 = strerror(*piVar8);
        printf("ERROR in line %d while %s:\n%s\n",0x21d,"allocating memory",pcVar9);
        local_7c = -1;
      }
      else {
        iVar1 = fseek(local_18,0,0);
        if (iVar1 < 0) {
          piVar8 = __errno_location();
          pcVar9 = strerror(*piVar8);
          printf("ERROR in line %d while %s:\n%s\n",0x21f,"setting file position",pcVar9);
          local_7c = -1;
        }
        else {
          sVar10 = fread(local_30,sVar10,1,local_18);
          if (sVar10 == 0) {
            piVar8 = __errno_location();
            pcVar9 = strerror(*piVar8);
            printf("ERROR in line %d while %s:\n%s\n",0x221,"reading JPEG data",pcVar9);
            local_7c = -1;
          }
          else {
            fclose(local_18);
            local_18 = (FILE *)0x0;
            pcVar9 = strrchr(in_RDI,0x2e);
            if (pcVar9 != (char *)0x0) {
              *pcVar9 = '\0';
            }
            local_20 = tjInitTransform();
            if (local_20 == (tjhandle)0x0) {
              in_stack_fffffffffffffe98 = tjGetErrorCode((tjhandle)0x0);
              in_stack_fffffffffffffe90 = (unsigned_long *)tjGetErrorStr2((tjhandle)0x0);
              if (((flags & 0x2000U) != 0) || (in_stack_fffffffffffffe98 != 0)) {
                pcVar9 = "ERROR";
                if (in_stack_fffffffffffffe98 == 0) {
                  pcVar9 = "WARNING";
                }
                printf("%s in line %d while %s:\n%s\n",pcVar9,0x228,"executing tjInitTransform()",
                       in_stack_fffffffffffffe90);
                local_7c = -1;
                goto LAB_001092c0;
              }
              iVar1 = strncmp(tjErrorStr,(char *)in_stack_fffffffffffffe90,200);
              if ((((iVar1 != 0) ||
                   (iVar1 = strncmp(tjErrorMsg,"executing tjInitTransform()",200), iVar1 != 0)) ||
                  (tjErrorCode != in_stack_fffffffffffffe98)) || (tjErrorLine != 0x228)) {
                strncpy(tjErrorStr,(char *)in_stack_fffffffffffffe90,199);
                strncpy(tjErrorMsg,"executing tjInitTransform()",199);
                tjErrorCode = in_stack_fffffffffffffe98;
                tjErrorLine = 0x228;
                in_stack_fffffffffffffe98 = tjErrorCode;
                printf("WARNING in line %d while %s:\n%s\n",0x228,"executing tjInitTransform()",
                       in_stack_fffffffffffffe90);
              }
            }
            puVar20 = &stack0xfffffffffffffeb8;
            iVar1 = tjDecompressHeader3(in_stack_fffffffffffffe08,in_stack_fffffffffffffe00,
                                        in_stack_fffffffffffffdf8,in_stack_fffffffffffffdf0,
                                        (int *)CONCAT44(in_stack_fffffffffffffdec,
                                                        in_stack_fffffffffffffde8),
                                        (int *)CONCAT44(in_stack_fffffffffffffde4,
                                                        in_stack_fffffffffffffde0),
                                        (int *)CONCAT44(in_stack_fffffffffffffe24,
                                                        in_stack_fffffffffffffe20));
            if (iVar1 == -1) {
              iVar1 = tjGetErrorCode(local_20);
              pcVar9 = tjGetErrorStr2(local_20);
              if (((flags & 0x2000U) != 0) || (iVar1 != 0)) {
                pcVar13 = "ERROR";
                if (iVar1 == 0) {
                  pcVar13 = "WARNING";
                }
                printf("%s in line %d while %s:\n%s\n",pcVar13,0x22b,
                       "executing tjDecompressHeader3()",pcVar9);
                local_7c = -1;
                goto LAB_001092c0;
              }
              iVar2 = strncmp(tjErrorStr,pcVar9,200);
              if (((iVar2 != 0) ||
                  (iVar2 = strncmp(tjErrorMsg,"executing tjDecompressHeader3()",200), iVar2 != 0))
                 || ((tjErrorCode != 0 || (tjErrorLine != 0x22b)))) {
                strncpy(tjErrorStr,pcVar9,199);
                strncpy(tjErrorMsg,"executing tjDecompressHeader3()",199);
                tjErrorLine = 0x22b;
                tjErrorCode = iVar1;
                printf("WARNING in line %d while %s:\n%s\n",0x22b,"executing tjDecompressHeader3()",
                       pcVar9);
              }
            }
            if ((0 < (int)uVar26) && (0 < (int)uVar25)) {
              if ((iVar23 == 4) || (iVar23 == 3)) {
                pf = 0xb;
                local_64 = 4;
              }
              if (quiet == 1) {
                printf("All performance values in Mpixels/sec\n\n");
                pcVar9 = "Image";
                if (doTile != 0) {
                  pcVar9 = "Tile ";
                }
                pcVar13 = "Image";
                if (doTile != 0) {
                  pcVar13 = "Tile ";
                }
                printf("Bitmap     JPEG   JPEG     %s  %s   Xform   Comp    Decomp  ",pcVar9,pcVar13
                      );
                if (doYUV != 0) {
                  printf("Decode");
                }
                printf("\n");
                printf("Format     CS     Subsamp  Width  Height  Perf    Ratio   Perf    ");
                if (doYUV != 0) {
                  printf("Perf");
                }
                printf("\n\n");
              }
              else if (quiet == 0) {
                pcVar9 = formatName((int)((ulong)puVar20 >> 0x20),(int)puVar20,(char *)0x1080d0);
                pcVar13 = "Top-down";
                if ((flags & 2U) != 0) {
                  pcVar13 = "Bottom-up";
                }
                printf(">>>>>  JPEG %s --> %s (%s)  <<<<<\n",pcVar9,pixFormatStr[pf],pcVar13);
              }
              local_194 = uVar26;
              if (doTile != 0) {
                local_194 = 0x10;
              }
              local_134 = local_194;
              local_198 = uVar25;
              if (doTile != 0) {
                local_198 = 0x10;
              }
              local_138 = local_198;
              do {
                local_38 = (void *)0x0;
                local_50 = (void *)0x0;
                if ((int)uVar26 < (int)local_134) {
                  local_134 = uVar26;
                }
                if ((int)uVar25 < (int)local_138) {
                  local_138 = uVar25;
                }
                local_13c = (int)(uVar26 + local_134 + -1) / (int)local_134;
                local_140 = (int)(uVar25 + local_138 + -1) / (int)local_138;
                local_28 = (undefined8 *)malloc((long)local_13c * 8 * (long)local_140);
                if (local_28 == (undefined8 *)0x0) {
                  piVar8 = __errno_location();
                  pcVar9 = strerror(*piVar8);
                  printf("ERROR in line %d while %s:\n%s\n",0x249,"allocating JPEG tile array",
                         pcVar9);
                  local_7c = -1;
                  goto LAB_001092c0;
                }
                memset(local_28,0,(long)local_13c * 8 * (long)local_140);
                local_38 = malloc((long)local_13c * 8 * (long)local_140);
                if (local_38 == (void *)0x0) {
                  piVar8 = __errno_location();
                  pcVar9 = strerror(*piVar8);
                  printf("ERROR in line %d while %s:\n%s\n",0x24d,"allocating JPEG size array",
                         pcVar9);
                  local_7c = -1;
                  goto LAB_001092c0;
                }
                memset(local_38,0,(long)local_13c * 8 * (long)local_140);
                uVar21 = in_stack_fffffffffffffde0;
                iVar1 = iVar24;
                uVar4 = uVar25;
                uVar3 = uVar26;
                if (((flags & 0x400U) != 0) &&
                   ((((doTile != 0 || (xformOp != 0)) || (xformOpt != 0)) ||
                    (customFilter !=
                     (_func_int_short_ptr_tjregion_tjregion_int_int_tjtransform_ptr *)0x0)))) {
                  for (local_74 = 0; uVar21 = in_stack_fffffffffffffde0, iVar1 = iVar24,
                      uVar4 = uVar25, uVar3 = uVar26, local_74 < local_13c * local_140;
                      local_74 = local_74 + 1) {
                    uVar11 = tjBufSize(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,
                                       (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
                    if (0x7fffffff < uVar11) {
                      printf("ERROR in line %d while %s:\n%s\n",0x254,"getting buffer size",
                             "Image is too large");
                      local_7c = -1;
                      goto LAB_001092c0;
                    }
                    tjBufSize(in_stack_fffffffffffffde4,in_stack_fffffffffffffde0,
                              (int)((ulong)in_stack_fffffffffffffdd8 >> 0x20));
                    puVar12 = tjAlloc(0);
                    local_28[local_74] = puVar12;
                    if (puVar12 == (uchar *)0x0) {
                      piVar8 = __errno_location();
                      pcVar9 = strerror(*piVar8);
                      printf("ERROR in line %d while %s:\n%s\n",599,"allocating JPEG tiles",pcVar9);
                      local_7c = -1;
                      goto LAB_001092c0;
                    }
                  }
                }
                in_stack_fffffffffffffde0 = local_134;
                uVar22 = local_138;
                uVar25 = uVar4;
                uVar26 = uVar3;
                if (quiet == 0) {
                  pcVar9 = "Image";
                  if (doTile != 0) {
                    pcVar9 = "Tile";
                  }
                  printf("\n%s size: %d x %d",pcVar9,(ulong)local_134,(ulong)local_138);
                  if ((sf.num != 1) || (sf.denom != 1)) {
                    printf(" --> %d x %d",
                           (long)(int)(uVar3 * sf.num + sf.denom + -1) / (long)sf.denom & 0xffffffff
                           ,(long)(int)(uVar4 * sf.num + sf.denom + -1) / (long)sf.denom &
                            0xffffffff);
                  }
                  printf("\n");
                }
                else if (quiet == 1) {
                  pcVar9 = "TD";
                  if ((flags & 2U) != 0) {
                    pcVar9 = "BU";
                  }
                  printf("%-4s (%s)  %-5s  %-5s    ",pixFormatStr[pf],pcVar9,csName[iVar23],
                         subNameLong[iVar1]);
                  printf("%-5d  %-5d   ",(ulong)local_134,(ulong)local_138);
                }
                iVar24 = iVar1;
                if (((doTile == 0) && (xformOp == 0)) &&
                   ((xformOpt == 0 &&
                    (customFilter ==
                     (_func_int_short_ptr_tjregion_tjregion_int_int_tjtransform_ptr *)0x0)))) {
                  if (quiet == 1) {
                    printf("N/A     N/A     ");
                    iVar24 = iVar1;
                  }
                  tjFree((uchar *)0x10909a);
                  *local_28 = 0;
                }
                else {
                  local_50 = malloc((long)local_13c * 0x28 * (long)local_140);
                  if (local_50 == (void *)0x0) {
                    piVar8 = __errno_location();
                    pcVar9 = strerror(*piVar8);
                    printf("ERROR in line %d while %s:\n%s\n",0x26b,
                           "allocating image transform array",pcVar9);
                    local_7c = -1;
                    goto LAB_001092c0;
                  }
                  if ((((xformOp == 3) || (xformOp == 4)) || (xformOp == 5)) || (xformOp == 7)) {
                    uVar22 = local_134;
                    in_stack_fffffffffffffde0 = local_138;
                    uVar4 = uVar26;
                    uVar3 = uVar25;
                  }
                  if ((xformOpt & 8U) != 0) {
                    iVar1 = 3;
                  }
                  if ((xformOp == 1) || (xformOp == 6)) {
                    uVar3 = uVar3 - (int)uVar3 % tjMCUWidth[iVar1];
                  }
                  if ((xformOp == 2) || (xformOp == 6)) {
                    uVar4 = uVar4 - (int)uVar4 % tjMCUHeight[iVar1];
                  }
                  if ((xformOp == 4) || (xformOp == 5)) {
                    uVar3 = uVar3 - (int)uVar3 % tjMCUHeight[iVar1];
                  }
                  if ((xformOp == 4) || (xformOp == 7)) {
                    uVar4 = uVar4 - (int)uVar4 % tjMCUWidth[iVar1];
                  }
                  iVar2 = (int)(uVar3 + in_stack_fffffffffffffde0 + -1) /
                          (int)in_stack_fffffffffffffde0;
                  iVar5 = (int)(uVar4 + uVar22 + -1) / (int)uVar22;
                  if ((((xformOp == 3) || (xformOp == 4)) || (xformOp == 5)) || (xformOp == 7)) {
                    if (iVar1 == 1) {
                      iVar1 = 4;
                    }
                    else if (iVar1 == 4) {
                      iVar1 = 1;
                    }
                  }
                  local_68 = 0;
                  for (local_6c = 0; local_6c < iVar5; local_6c = local_6c + 1) {
                    for (local_70 = 0; local_70 < iVar2; local_70 = local_70 + 1) {
                      local_1ac = in_stack_fffffffffffffde0;
                      if ((int)(uVar3 - local_70 * in_stack_fffffffffffffde0) <=
                          (int)in_stack_fffffffffffffde0) {
                        local_1ac = uVar3 - local_70 * in_stack_fffffffffffffde0;
                      }
                      *(uint *)((long)local_50 + (long)local_68 * 0x28 + 8) = local_1ac;
                      local_1b0 = uVar22;
                      if ((int)(uVar4 - local_6c * uVar22) <= (int)uVar22) {
                        local_1b0 = uVar4 - local_6c * uVar22;
                      }
                      *(uint *)((long)local_50 + (long)local_68 * 0x28 + 0xc) = local_1b0;
                      *(uint *)((long)local_50 + (long)local_68 * 0x28) =
                           local_70 * in_stack_fffffffffffffde0;
                      *(uint *)((long)local_50 + (long)local_68 * 0x28 + 4) = local_6c * uVar22;
                      *(int *)((long)local_50 + (long)local_68 * 0x28 + 0x10) = xformOp;
                      *(uint *)((long)local_50 + (long)local_68 * 0x28 + 0x14) = xformOpt | 2;
                      *(_func_int_short_ptr_tjregion_tjregion_int_int_tjtransform_ptr **)
                       ((long)local_50 + (long)local_68 * 0x28 + 0x20) = customFilter;
                      if (((*(uint *)((long)local_50 + (long)local_68 * 0x28 + 0x14) & 0x10) != 0)
                         && (local_28[local_68] != 0)) {
                        tjFree((uchar *)0x108ad3);
                        local_28[local_68] = 0;
                      }
                      local_68 = local_68 + 1;
                    }
                  }
                  local_78 = -1;
                  local_60 = 0.0;
                  do {
                    while( true ) {
                      dVar15 = getTime();
                      iVar6 = tjTransform((tjhandle)CONCAT44(iVar24,iVar23),
                                          (uchar *)CONCAT44(uVar3,uVar4),
                                          CONCAT44(in_stack_fffffffffffffde0,uVar22),iVar2,
                                          (uchar **)CONCAT44(iVar1,in_stack_fffffffffffffe98),
                                          in_stack_fffffffffffffe90,
                                          (tjtransform *)CONCAT44(uVar26,uVar25),
                                          in_stack_fffffffffffffed8);
                      if (iVar6 == -1) {
                        iVar6 = tjGetErrorCode(local_20);
                        pcVar9 = tjGetErrorStr2(local_20);
                        if (((flags & 0x2000U) != 0) || (iVar6 != 0)) {
                          pcVar13 = "ERROR";
                          if (iVar6 == 0) {
                            pcVar13 = "WARNING";
                          }
                          printf("%s in line %d while %s:\n%s\n",pcVar13,0x299,
                                 "executing tjTransform()",pcVar9);
                          local_7c = -1;
                          goto LAB_001092c0;
                        }
                        iVar7 = strncmp(tjErrorStr,pcVar9,200);
                        if ((((iVar7 != 0) ||
                             (iVar7 = strncmp(tjErrorMsg,"executing tjTransform()",200), iVar7 != 0)
                             ) || (tjErrorCode != 0)) || (tjErrorLine != 0x299)) {
                          strncpy(tjErrorStr,pcVar9,199);
                          strncpy(tjErrorMsg,"executing tjTransform()",199);
                          tjErrorLine = 0x299;
                          tjErrorCode = iVar6;
                          printf("WARNING in line %d while %s:\n%s\n",0x299,
                                 "executing tjTransform()",pcVar9);
                        }
                      }
                      dVar16 = getTime();
                      local_60 = (dVar16 - dVar15) + local_60;
                      if (-1 < local_78) break;
                      if (warmup <= local_60) {
                        local_78 = 0;
                        local_60 = 0.0;
                      }
                    }
                    local_78 = local_78 + 1;
                  } while (local_60 < benchTime);
                  free(local_50);
                  local_48 = 0;
                  for (local_68 = 0; local_68 < iVar2 * iVar5; local_68 = local_68 + 1) {
                    local_48 = *(long *)((long)local_38 + (long)local_68 * 8) + local_48;
                  }
                  if (quiet == 0) {
                    printf("Transform     --> Frame rate:         %f fps\n",1.0 / local_60);
                    printf("                  Output image size:  %lu bytes\n");
                    uVar19 = (undefined4)((ulong)local_48 >> 0x20);
                    auVar18._8_4_ = uVar19;
                    auVar18._0_8_ = local_48;
                    auVar18._12_4_ = 0x45300000;
                    in_stack_fffffffffffffe28 = 4503599627370496.0;
                    in_stack_fffffffffffffe30 = (char *)0x4530000000000000;
                    printf("                  Compression ratio:  %f:1\n",
                           (double)(int)(uVar26 * uVar25 * local_64) /
                           ((auVar18._8_8_ - 1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)local_48) - 4503599627370496.0)));
                    printf("                  Throughput:         %f Megapixels/sec\n",
                           ((double)(int)(uVar26 * uVar25) / 1000000.0) / local_60);
                    auVar17._8_4_ = uVar19;
                    auVar17._0_8_ = local_48;
                    auVar17._12_4_ = 0x45300000;
                    printf("                  Output bit stream:  %f Megabits/sec\n",
                           ((((auVar17._8_8_ - (double)in_stack_fffffffffffffe30) +
                             ((double)CONCAT44(0x43300000,(int)local_48) - in_stack_fffffffffffffe28
                             )) * 8.0) / 1000000.0) / local_60);
                  }
                  else {
                    in_stack_fffffffffffffe40 =
                         sigfig((double)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                                in_stack_fffffffffffffe30,
                                (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
                    pcVar9 = "  ";
                    if (quiet == 2) {
                      pcVar9 = "\n";
                    }
                    pcVar13 = sigfig((double)in_stack_fffffffffffffe40,in_stack_fffffffffffffe3c,
                                     in_stack_fffffffffffffe30,
                                     (int)((ulong)in_stack_fffffffffffffe28 >> 0x20));
                    pcVar14 = "  ";
                    if (quiet == 2) {
                      pcVar14 = "\n";
                    }
                    printf("%-6s%s%-6s%s",in_stack_fffffffffffffe40,pcVar9,pcVar13,pcVar14);
                  }
                }
                local_50 = (void *)0x0;
                if (uVar26 == local_134) {
                  in_stack_fffffffffffffde0 = uVar3;
                }
                if ((xformOpt & 0x10U) == 0) {
                  in_stack_fffffffffffffdd8 = in_RDI;
                  iVar1 = decomp(in_stack_00000388,in_stack_00000380,in_stack_00000378,
                                 in_stack_00000370,in_stack_0000036c,in_stack_00000368,
                                 in_stack_000003a0,in_stack_000003a8,in_stack_000003b0,
                                 in_stack_000003b8,in_stack_000003c0);
                  if (iVar1 == -1) goto LAB_001092c0;
                }
                else {
                  in_stack_fffffffffffffde0 = uVar21;
                  if (quiet == 1) {
                    printf("N/A\n");
                    in_stack_fffffffffffffde0 = uVar21;
                  }
                }
                for (local_74 = 0; local_50 = (void *)0x0, local_74 < local_13c * local_140;
                    local_74 = local_74 + 1) {
                  tjFree((uchar *)0x109218);
                  local_28[local_74] = 0;
                }
                free(local_28);
                local_28 = (undefined8 *)0x0;
                free(local_38);
                local_38 = (void *)0x0;
                if ((local_134 == uVar26) && (local_138 == uVar25)) goto LAB_001092c0;
                local_134 = local_134 << 1;
                local_138 = local_138 << 1;
              } while( true );
            }
            printf("ERROR in line %d while %s:\n%s\n",0x22d,"reading JPEG header",
                   "Invalid image dimensions");
            local_7c = -1;
          }
        }
      }
    }
  }
LAB_001092c0:
  if (local_18 != (FILE *)0x0) {
    fclose(local_18);
  }
  if (local_28 != (undefined8 *)0x0) {
    for (local_74 = 0; local_74 < local_13c * local_140; local_74 = local_74 + 1) {
      tjFree((uchar *)0x109321);
    }
  }
  free(local_28);
  free(local_38);
  free(local_30);
  free(local_50);
  if (local_20 != (tjhandle)0x0) {
    tjDestroy(in_stack_fffffffffffffdd8);
  }
  return local_7c;
}

Assistant:

static int decompTest(char *fileName)
{
  FILE *file = NULL;
  tjhandle handle = NULL;
  unsigned char **jpegBuf = NULL, *srcBuf = NULL;
  unsigned long *jpegSize = NULL, srcSize, totalJpegSize;
  tjtransform *t = NULL;
  double start, elapsed;
  int ps = tjPixelSize[pf], tile, row, col, i, iter, retval = 0, decompsrc = 0;
  char *temp = NULL, tempStr[80], tempStr2[80];
  /* Original image */
  int w = 0, h = 0, tilew, tileh, ntilesw = 1, ntilesh = 1, subsamp = -1,
    cs = -1;
  /* Transformed image */
  int tw, th, ttilew, ttileh, tntilesw, tntilesh, tsubsamp;

  if ((file = fopen(fileName, "rb")) == NULL)
    THROW_UNIX("opening file");
  if (fseek(file, 0, SEEK_END) < 0 ||
      (srcSize = ftell(file)) == (unsigned long)-1)
    THROW_UNIX("determining file size");
  if ((srcBuf = (unsigned char *)malloc(srcSize)) == NULL)
    THROW_UNIX("allocating memory");
  if (fseek(file, 0, SEEK_SET) < 0)
    THROW_UNIX("setting file position");
  if (fread(srcBuf, srcSize, 1, file) < 1)
    THROW_UNIX("reading JPEG data");
  fclose(file);  file = NULL;

  temp = strrchr(fileName, '.');
  if (temp != NULL) *temp = '\0';

  if ((handle = tjInitTransform()) == NULL)
    THROW_TJ("executing tjInitTransform()");
  if (tjDecompressHeader3(handle, srcBuf, srcSize, &w, &h, &subsamp,
                          &cs) == -1)
    THROW_TJ("executing tjDecompressHeader3()");
  if (w < 1 || h < 1)
    THROW("reading JPEG header", "Invalid image dimensions");
  if (cs == TJCS_YCCK || cs == TJCS_CMYK) {
    pf = TJPF_CMYK;  ps = tjPixelSize[pf];
  }

  if (quiet == 1) {
    printf("All performance values in Mpixels/sec\n\n");
    printf("Bitmap     JPEG   JPEG     %s  %s   Xform   Comp    Decomp  ",
           doTile ? "Tile " : "Image", doTile ? "Tile " : "Image");
    if (doYUV) printf("Decode");
    printf("\n");
    printf("Format     CS     Subsamp  Width  Height  Perf    Ratio   Perf    ");
    if (doYUV) printf("Perf");
    printf("\n\n");
  } else if (!quiet)
    printf(">>>>>  JPEG %s --> %s (%s)  <<<<<\n",
           formatName(subsamp, cs, tempStr), pixFormatStr[pf],
           (flags & TJFLAG_BOTTOMUP) ? "Bottom-up" : "Top-down");

  for (tilew = doTile ? 16 : w, tileh = doTile ? 16 : h; ;
       tilew *= 2, tileh *= 2) {
    if (tilew > w) tilew = w;
    if (tileh > h) tileh = h;
    ntilesw = (w + tilew - 1) / tilew;
    ntilesh = (h + tileh - 1) / tileh;

    if ((jpegBuf = (unsigned char **)malloc(sizeof(unsigned char *) *
                                            ntilesw * ntilesh)) == NULL)
      THROW_UNIX("allocating JPEG tile array");
    memset(jpegBuf, 0, sizeof(unsigned char *) * ntilesw * ntilesh);
    if ((jpegSize = (unsigned long *)malloc(sizeof(unsigned long) *
                                            ntilesw * ntilesh)) == NULL)
      THROW_UNIX("allocating JPEG size array");
    memset(jpegSize, 0, sizeof(unsigned long) * ntilesw * ntilesh);

    if ((flags & TJFLAG_NOREALLOC) != 0 &&
        (doTile || xformOp != TJXOP_NONE || xformOpt != 0 || customFilter))
      for (i = 0; i < ntilesw * ntilesh; i++) {
        if (tjBufSize(tilew, tileh, subsamp) > (unsigned long)INT_MAX)
          THROW("getting buffer size", "Image is too large");
        if ((jpegBuf[i] = (unsigned char *)
                          tjAlloc(tjBufSize(tilew, tileh, subsamp))) == NULL)
          THROW_UNIX("allocating JPEG tiles");
      }

    tw = w;  th = h;  ttilew = tilew;  ttileh = tileh;
    if (!quiet) {
      printf("\n%s size: %d x %d", doTile ? "Tile" : "Image", ttilew, ttileh);
      if (sf.num != 1 || sf.denom != 1)
        printf(" --> %d x %d", TJSCALED(tw, sf), TJSCALED(th, sf));
      printf("\n");
    } else if (quiet == 1) {
      printf("%-4s (%s)  %-5s  %-5s    ", pixFormatStr[pf],
             (flags & TJFLAG_BOTTOMUP) ? "BU" : "TD", csName[cs],
             subNameLong[subsamp]);
      printf("%-5d  %-5d   ", tilew, tileh);
    }

    tsubsamp = subsamp;
    if (doTile || xformOp != TJXOP_NONE || xformOpt != 0 || customFilter) {
      if ((t = (tjtransform *)malloc(sizeof(tjtransform) * ntilesw *
                                     ntilesh)) == NULL)
        THROW_UNIX("allocating image transform array");

      if (xformOp == TJXOP_TRANSPOSE || xformOp == TJXOP_TRANSVERSE ||
          xformOp == TJXOP_ROT90 || xformOp == TJXOP_ROT270) {
        tw = h;  th = w;  ttilew = tileh;  ttileh = tilew;
      }

      if (xformOpt & TJXOPT_GRAY) tsubsamp = TJ_GRAYSCALE;
      if (xformOp == TJXOP_HFLIP || xformOp == TJXOP_ROT180)
        tw = tw - (tw % tjMCUWidth[tsubsamp]);
      if (xformOp == TJXOP_VFLIP || xformOp == TJXOP_ROT180)
        th = th - (th % tjMCUHeight[tsubsamp]);
      if (xformOp == TJXOP_TRANSVERSE || xformOp == TJXOP_ROT90)
        tw = tw - (tw % tjMCUHeight[tsubsamp]);
      if (xformOp == TJXOP_TRANSVERSE || xformOp == TJXOP_ROT270)
        th = th - (th % tjMCUWidth[tsubsamp]);
      tntilesw = (tw + ttilew - 1) / ttilew;
      tntilesh = (th + ttileh - 1) / ttileh;

      if (xformOp == TJXOP_TRANSPOSE || xformOp == TJXOP_TRANSVERSE ||
          xformOp == TJXOP_ROT90 || xformOp == TJXOP_ROT270) {
        if (tsubsamp == TJSAMP_422) tsubsamp = TJSAMP_440;
        else if (tsubsamp == TJSAMP_440) tsubsamp = TJSAMP_422;
      }

      for (row = 0, tile = 0; row < tntilesh; row++) {
        for (col = 0; col < tntilesw; col++, tile++) {
          t[tile].r.w = min(ttilew, tw - col * ttilew);
          t[tile].r.h = min(ttileh, th - row * ttileh);
          t[tile].r.x = col * ttilew;
          t[tile].r.y = row * ttileh;
          t[tile].op = xformOp;
          t[tile].options = xformOpt | TJXOPT_TRIM;
          t[tile].customFilter = customFilter;
          if (t[tile].options & TJXOPT_NOOUTPUT && jpegBuf[tile]) {
            tjFree(jpegBuf[tile]);  jpegBuf[tile] = NULL;
          }
        }
      }

      iter = -1;
      elapsed = 0.;
      while (1) {
        start = getTime();
        if (tjTransform(handle, srcBuf, srcSize, tntilesw * tntilesh, jpegBuf,
                        jpegSize, t, flags) == -1)
          THROW_TJ("executing tjTransform()");
        elapsed += getTime() - start;
        if (iter >= 0) {
          iter++;
          if (elapsed >= benchTime) break;
        } else if (elapsed >= warmup) {
          iter = 0;
          elapsed = 0.;
        }
      }

      free(t);  t = NULL;

      for (tile = 0, totalJpegSize = 0; tile < tntilesw * tntilesh; tile++)
        totalJpegSize += jpegSize[tile];

      if (quiet) {
        printf("%-6s%s%-6s%s",
               sigfig((double)(w * h) / 1000000. / elapsed, 4, tempStr, 80),
               quiet == 2 ? "\n" : "  ",
               sigfig((double)(w * h * ps) / (double)totalJpegSize, 4,
                      tempStr2, 80),
               quiet == 2 ? "\n" : "  ");
      } else if (!quiet) {
        printf("Transform     --> Frame rate:         %f fps\n",
               1.0 / elapsed);
        printf("                  Output image size:  %lu bytes\n",
               totalJpegSize);
        printf("                  Compression ratio:  %f:1\n",
               (double)(w * h * ps) / (double)totalJpegSize);
        printf("                  Throughput:         %f Megapixels/sec\n",
               (double)(w * h) / 1000000. / elapsed);
        printf("                  Output bit stream:  %f Megabits/sec\n",
               (double)totalJpegSize * 8. / 1000000. / elapsed);
      }
    } else {
      if (quiet == 1) printf("N/A     N/A     ");
      tjFree(jpegBuf[0]);
      jpegBuf[0] = NULL;
      decompsrc = 1;
    }

    if (w == tilew) ttilew = tw;
    if (h == tileh) ttileh = th;
    if (!(xformOpt & TJXOPT_NOOUTPUT)) {
      if (decomp(NULL, decompsrc ? &srcBuf : jpegBuf,
                 decompsrc ? &srcSize : jpegSize, NULL, tw, th, tsubsamp, 0,
                 fileName, ttilew, ttileh) == -1)
        goto bailout;
    } else if (quiet == 1) printf("N/A\n");

    for (i = 0; i < ntilesw * ntilesh; i++) {
      tjFree(jpegBuf[i]);
      jpegBuf[i] = NULL;
    }
    free(jpegBuf);  jpegBuf = NULL;
    free(jpegSize);  jpegSize = NULL;

    if (tilew == w && tileh == h) break;
  }

bailout:
  if (file) fclose(file);
  if (jpegBuf) {
    for (i = 0; i < ntilesw * ntilesh; i++)
      tjFree(jpegBuf[i]);
  }
  free(jpegBuf);
  free(jpegSize);
  free(srcBuf);
  free(t);
  if (handle) { tjDestroy(handle);  handle = NULL; }
  return retval;
}